

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specwriter.cpp
# Opt level: O2

bool __thiscall
apngasm::spec::SpecWriter::writeJSON(SpecWriter *this,string *filePath,string *imageDir)

{
  ssize_t sVar1;
  size_t in_RCX;
  undefined1 uVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  JSONSpecWriterImpl impl;
  
  if (this->_pApngasm == (APNGAsm *)0x0) {
    uVar2 = 0;
  }
  else {
    priv::JSONSpecWriterImpl::JSONSpecWriterImpl(&impl,this->_pApngasm,this->_pListener);
    std::operator+(&local_50,imageDir,'/');
    anon_unknown_0::createRelativeDir(&local_70,filePath,&local_50);
    sVar1 = priv::JSONSpecWriterImpl::write(&impl,(int)filePath,&local_70,in_RCX);
    uVar2 = (undefined1)sVar1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (bool)uVar2;
}

Assistant:

bool SpecWriter::writeJSON(const std::string& filePath, const std::string& imageDir) const
    {
      if (!_pApngasm)
        return false;

      priv::JSONSpecWriterImpl impl(_pApngasm, _pListener);
      return impl.write(filePath, createRelativeDir(filePath, imageDir + separator));
    }